

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined8 *puVar6;
  int iVar7;
  undefined4 uVar8;
  size_t sVar9;
  undefined8 uVar10;
  Scene *pSVar11;
  Geometry *pGVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar31;
  undefined4 uVar32;
  uint uVar33;
  int iVar34;
  undefined4 uVar35;
  long lVar36;
  RTCRayN *pRVar37;
  long lVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  long lVar44;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar45;
  ulong uVar46;
  size_t sVar47;
  float fVar48;
  float fVar81;
  float fVar83;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar49;
  float fVar82;
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar80;
  float fVar87;
  uint uVar88;
  float fVar99;
  float fVar101;
  float fVar102;
  undefined1 auVar89 [16];
  uint uVar100;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar103;
  float fVar111;
  float fVar112;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar107;
  float fVar113;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar114;
  float fVar130;
  float fVar131;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar118;
  float fVar132;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar133;
  float fVar136;
  float fVar137;
  undefined1 auVar134 [16];
  float fVar138;
  undefined1 auVar135 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar142;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar145;
  float fVar149;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar150;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar156;
  float fVar159;
  float fVar160;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar161;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar181;
  float fVar182;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  undefined1 auVar183 [16];
  vbool<4> valid;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  RTCFilterFunctionNArguments args;
  undefined8 local_1258;
  undefined8 uStack_1250;
  vfloat<4> tNear;
  undefined1 local_11d8 [16];
  undefined1 local_11c8 [16];
  undefined1 local_11b8 [16];
  undefined1 local_11a8 [16];
  undefined1 local_1198 [16];
  undefined1 local_1188 [16];
  undefined1 local_1178 [16];
  undefined1 local_1168 [16];
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float local_1128;
  float fStack_1124;
  float fStack_1120;
  float fStack_111c;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  ulong local_10e8;
  ulong local_10e0;
  ulong local_10d8;
  ulong local_10d0;
  undefined1 local_10c8 [16];
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined4 local_1078;
  undefined4 uStack_1074;
  undefined4 uStack_1070;
  undefined4 uStack_106c;
  undefined4 local_1068;
  undefined4 uStack_1064;
  undefined4 uStack_1060;
  undefined4 uStack_105c;
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  uint local_1038;
  uint uStack_1034;
  uint uStack_1030;
  uint uStack_102c;
  uint local_1028;
  uint uStack_1024;
  uint uStack_1020;
  uint uStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar45 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  local_fa8 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_fb8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_fc8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_fd8 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_fe8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_ff8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1018 = local_fd8 * 0.99999964;
  local_10b8 = local_fe8 * 0.99999964;
  local_1008 = local_ff8 * 0.99999964;
  local_fd8 = local_fd8 * 1.0000004;
  local_fe8 = local_fe8 * 1.0000004;
  local_ff8 = local_ff8 * 1.0000004;
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_10e8 = uVar40 ^ 0x10;
  local_10d8 = uVar41 ^ 0x10;
  local_10e0 = uVar42 ^ 0x10;
  iVar34 = (tray->tnear).field_0.i[k];
  local_10c8._4_4_ = iVar34;
  local_10c8._0_4_ = iVar34;
  local_10c8._8_4_ = iVar34;
  local_10c8._12_4_ = iVar34;
  iVar34 = (tray->tfar).field_0.i[k];
  auVar120._4_4_ = iVar34;
  auVar120._0_4_ = iVar34;
  auVar120._8_4_ = iVar34;
  auVar120._12_4_ = iVar34;
  local_f88 = mm_lookupmask_ps._0_8_;
  uStack_f80 = mm_lookupmask_ps._8_8_;
  local_f98 = mm_lookupmask_ps._240_8_;
  uStack_f90 = mm_lookupmask_ps._248_8_;
  lVar38 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
  fStack_fa4 = local_fa8;
  fStack_fa0 = local_fa8;
  fStack_f9c = local_fa8;
  fStack_fb4 = local_fb8;
  fStack_fb0 = local_fb8;
  fStack_fac = local_fb8;
  fStack_fc4 = local_fc8;
  fStack_fc0 = local_fc8;
  fStack_fbc = local_fc8;
  fStack_fd4 = local_fd8;
  fStack_fd0 = local_fd8;
  fStack_fcc = local_fd8;
  fStack_fe4 = local_fe8;
  fStack_fe0 = local_fe8;
  fStack_fdc = local_fe8;
  fStack_ff4 = local_ff8;
  fStack_ff0 = local_ff8;
  fStack_fec = local_ff8;
  fStack_1004 = local_1008;
  fStack_1000 = local_1008;
  fStack_ffc = local_1008;
  fStack_1014 = local_1018;
  fStack_1010 = local_1018;
  fStack_100c = local_1018;
  fStack_10b4 = local_10b8;
  fStack_10b0 = local_10b8;
  fStack_10ac = local_10b8;
  uVar39 = local_10e8;
  auVar59 = local_10c8;
  fVar170 = local_fc8;
  fVar132 = local_fc8;
  fVar102 = local_fc8;
  fVar160 = local_fc8;
  fVar145 = local_fd8;
  fVar149 = local_fd8;
  fVar48 = local_fd8;
  fVar49 = local_fd8;
  fVar81 = local_fe8;
  fVar82 = local_fe8;
  fVar83 = local_fe8;
  fVar84 = local_fe8;
  fVar85 = local_ff8;
  fVar86 = local_ff8;
  fVar87 = local_ff8;
  fVar99 = local_ff8;
  fVar101 = local_10b8;
  fVar103 = local_10b8;
  fVar111 = local_10b8;
  fVar112 = local_10b8;
  fVar113 = local_fa8;
  fVar114 = local_fa8;
  fVar130 = local_fa8;
  fVar131 = local_fa8;
  fVar133 = local_fb8;
  fVar136 = local_fb8;
  fVar137 = local_fb8;
  fVar138 = local_fb8;
  fVar150 = local_1008;
  fVar153 = local_1008;
  fVar154 = local_1008;
  fVar155 = local_1008;
  fVar156 = local_1018;
  fVar159 = local_1018;
  fVar161 = local_1018;
  fVar164 = local_1018;
  do {
    do {
      do {
        if (pSVar45 == stack) {
          return;
        }
        pSVar31 = pSVar45 + -1;
        pSVar45 = pSVar45 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar31->dist &&
               (float)pSVar31->dist != *(float *)(ray + k * 4 + 0x80));
      sVar47 = (pSVar45->ptr).ptr;
      do {
        if ((sVar47 & 8) == 0) {
          pfVar2 = (float *)(sVar47 + 0x20 + uVar40);
          auVar50._0_4_ = (*pfVar2 - fVar113) * fVar156;
          auVar50._4_4_ = (pfVar2[1] - fVar114) * fVar159;
          auVar50._8_4_ = (pfVar2[2] - fVar130) * fVar161;
          auVar50._12_4_ = (pfVar2[3] - fVar131) * fVar164;
          pfVar2 = (float *)(sVar47 + 0x20 + uVar41);
          auVar141._0_4_ = (*pfVar2 - fVar133) * fVar101;
          auVar141._4_4_ = (pfVar2[1] - fVar136) * fVar103;
          auVar141._8_4_ = (pfVar2[2] - fVar137) * fVar111;
          auVar141._12_4_ = (pfVar2[3] - fVar138) * fVar112;
          auVar50 = maxps(auVar50,auVar141);
          pfVar2 = (float *)(sVar47 + 0x20 + uVar42);
          auVar147._0_4_ = (*pfVar2 - fVar170) * fVar150;
          auVar147._4_4_ = (pfVar2[1] - fVar132) * fVar153;
          auVar147._8_4_ = (pfVar2[2] - fVar102) * fVar154;
          auVar147._12_4_ = (pfVar2[3] - fVar160) * fVar155;
          auVar104 = maxps(auVar147,auVar59);
          tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar50,auVar104);
          pfVar2 = (float *)(sVar47 + 0x20 + uVar39);
          auVar105._0_4_ = (*pfVar2 - fVar113) * fVar145;
          auVar105._4_4_ = (pfVar2[1] - fVar114) * fVar149;
          auVar105._8_4_ = (pfVar2[2] - fVar130) * fVar48;
          auVar105._12_4_ = (pfVar2[3] - fVar131) * fVar49;
          pfVar2 = (float *)(sVar47 + 0x20 + local_10d8);
          auVar115._0_4_ = (*pfVar2 - fVar133) * fVar81;
          auVar115._4_4_ = (pfVar2[1] - fVar136) * fVar82;
          auVar115._8_4_ = (pfVar2[2] - fVar137) * fVar83;
          auVar115._12_4_ = (pfVar2[3] - fVar138) * fVar84;
          auVar50 = minps(auVar105,auVar115);
          pfVar2 = (float *)(sVar47 + 0x20 + local_10e0);
          auVar116._0_4_ = (*pfVar2 - fVar170) * fVar85;
          auVar116._4_4_ = (pfVar2[1] - fVar132) * fVar86;
          auVar116._8_4_ = (pfVar2[2] - fVar102) * fVar87;
          auVar116._12_4_ = (pfVar2[3] - fVar160) * fVar99;
          auVar104 = minps(auVar116,auVar120);
          auVar50 = minps(auVar50,auVar104);
          auVar104._4_4_ = -(uint)(tNear.field_0._4_4_ <= auVar50._4_4_);
          auVar104._0_4_ = -(uint)(tNear.field_0._0_4_ <= auVar50._0_4_);
          auVar104._8_4_ = -(uint)(tNear.field_0._8_4_ <= auVar50._8_4_);
          auVar104._12_4_ = -(uint)(tNear.field_0._12_4_ <= auVar50._12_4_);
          uVar32 = movmskps((int)local_10e0,auVar104);
          local_10d0 = CONCAT44((int)(local_10e0 >> 0x20),uVar32);
        }
        if ((sVar47 & 8) == 0) {
          if (local_10d0 == 0) {
            iVar34 = 4;
          }
          else {
            uVar46 = sVar47 & 0xfffffffffffffff0;
            lVar44 = 0;
            if (local_10d0 != 0) {
              for (; (local_10d0 >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
              }
            }
            iVar34 = 0;
            sVar47 = *(size_t *)(uVar46 + lVar44 * 8);
            uVar43 = local_10d0 - 1 & local_10d0;
            if (uVar43 != 0) {
              uVar33 = tNear.field_0.i[lVar44];
              lVar44 = 0;
              if (uVar43 != 0) {
                for (; (uVar43 >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
                }
              }
              sVar9 = *(size_t *)(uVar46 + lVar44 * 8);
              uVar88 = tNear.field_0.i[lVar44];
              uVar43 = uVar43 - 1 & uVar43;
              if (uVar43 == 0) {
                if (uVar33 < uVar88) {
                  (pSVar45->ptr).ptr = sVar9;
                  pSVar45->dist = uVar88;
                  pSVar45 = pSVar45 + 1;
                }
                else {
                  (pSVar45->ptr).ptr = sVar47;
                  pSVar45->dist = uVar33;
                  pSVar45 = pSVar45 + 1;
                  sVar47 = sVar9;
                }
              }
              else {
                auVar106._8_4_ = uVar33;
                auVar106._0_8_ = sVar47;
                auVar106._12_4_ = 0;
                auVar139._8_4_ = uVar88;
                auVar139._0_8_ = sVar9;
                auVar139._12_4_ = 0;
                lVar44 = 0;
                if (uVar43 != 0) {
                  for (; (uVar43 >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
                  }
                }
                uVar10 = *(undefined8 *)(uVar46 + lVar44 * 8);
                iVar7 = tNear.field_0.i[lVar44];
                auVar117._8_4_ = iVar7;
                auVar117._0_8_ = uVar10;
                auVar117._12_4_ = 0;
                auVar51._8_4_ = -(uint)((int)uVar33 < (int)uVar88);
                uVar43 = uVar43 - 1 & uVar43;
                if (uVar43 == 0) {
                  auVar51._4_4_ = auVar51._8_4_;
                  auVar51._0_4_ = auVar51._8_4_;
                  auVar51._12_4_ = auVar51._8_4_;
                  auVar134._8_4_ = uVar88;
                  auVar134._0_8_ = sVar9;
                  auVar134._12_4_ = 0;
                  auVar104 = blendvps(auVar134,auVar106,auVar51);
                  auVar50 = blendvps(auVar106,auVar139,auVar51);
                  auVar52._8_4_ = -(uint)(auVar104._8_4_ < iVar7);
                  auVar52._4_4_ = auVar52._8_4_;
                  auVar52._0_4_ = auVar52._8_4_;
                  auVar52._12_4_ = auVar52._8_4_;
                  auVar140._8_4_ = iVar7;
                  auVar140._0_8_ = uVar10;
                  auVar140._12_4_ = 0;
                  auVar141 = blendvps(auVar140,auVar104,auVar52);
                  auVar104 = blendvps(auVar104,auVar117,auVar52);
                  auVar53._8_4_ = -(uint)(auVar50._8_4_ < auVar104._8_4_);
                  auVar53._4_4_ = auVar53._8_4_;
                  auVar53._0_4_ = auVar53._8_4_;
                  auVar53._12_4_ = auVar53._8_4_;
                  SVar118 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar104,auVar50,auVar53);
                  SVar107 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar50,auVar104,auVar53);
                  *pSVar45 = SVar107;
                  pSVar45[1] = SVar118;
                  sVar47 = auVar141._0_8_;
                  pSVar45 = pSVar45 + 2;
                }
                else {
                  lVar44 = 0;
                  if (uVar43 != 0) {
                    for (; (uVar43 >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
                    }
                  }
                  auVar59._4_4_ = auVar51._8_4_;
                  auVar59._0_4_ = auVar51._8_4_;
                  auVar59._8_4_ = auVar51._8_4_;
                  auVar59._12_4_ = auVar51._8_4_;
                  auVar104 = blendvps(auVar139,auVar106,auVar59);
                  auVar59 = blendvps(auVar106,auVar139,auVar59);
                  auVar146._8_4_ = tNear.field_0.i[lVar44];
                  auVar146._0_8_ = *(undefined8 *)(uVar46 + lVar44 * 8);
                  auVar146._12_4_ = 0;
                  auVar54._8_4_ = -(uint)(iVar7 < tNear.field_0.i[lVar44]);
                  auVar54._4_4_ = auVar54._8_4_;
                  auVar54._0_4_ = auVar54._8_4_;
                  auVar54._12_4_ = auVar54._8_4_;
                  auVar141 = blendvps(auVar146,auVar117,auVar54);
                  auVar50 = blendvps(auVar117,auVar146,auVar54);
                  auVar55._8_4_ = -(uint)(auVar59._8_4_ < auVar50._8_4_);
                  auVar55._4_4_ = auVar55._8_4_;
                  auVar55._0_4_ = auVar55._8_4_;
                  auVar55._12_4_ = auVar55._8_4_;
                  auVar147 = blendvps(auVar50,auVar59,auVar55);
                  SVar107 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar59,auVar50,auVar55);
                  auVar56._8_4_ = -(uint)(auVar104._8_4_ < auVar141._8_4_);
                  auVar56._4_4_ = auVar56._8_4_;
                  auVar56._0_4_ = auVar56._8_4_;
                  auVar56._12_4_ = auVar56._8_4_;
                  auVar59 = blendvps(auVar141,auVar104,auVar56);
                  auVar50 = blendvps(auVar104,auVar141,auVar56);
                  auVar57._8_4_ = -(uint)(auVar50._8_4_ < auVar147._8_4_);
                  auVar57._4_4_ = auVar57._8_4_;
                  auVar57._0_4_ = auVar57._8_4_;
                  auVar57._12_4_ = auVar57._8_4_;
                  SVar142 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar147,auVar50,auVar57);
                  SVar118 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar50,auVar147,auVar57);
                  *pSVar45 = SVar107;
                  pSVar45[1] = SVar118;
                  pSVar45[2] = SVar142;
                  sVar47 = auVar59._0_8_;
                  pSVar45 = pSVar45 + 3;
                  auVar59 = local_10c8;
                  fVar101 = local_10b8;
                  fVar103 = fStack_10b4;
                  fVar111 = fStack_10b0;
                  fVar112 = fStack_10ac;
                }
              }
            }
          }
        }
        else {
          iVar34 = 6;
        }
      } while (iVar34 == 0);
    } while (iVar34 != 6);
    uVar39 = (ulong)((uint)sVar47 & 0xf);
    if (uVar39 != 8) {
      uVar46 = sVar47 & 0xfffffffffffffff0;
      lVar44 = 0;
      do {
        lVar36 = lVar44 * 0xe0;
        puVar6 = (undefined8 *)(uVar46 + 0xd0 + lVar36);
        local_1258 = *puVar6;
        uStack_1250 = puVar6[1];
        fVar170 = *(float *)(ray + k * 4);
        fVar132 = *(float *)(ray + k * 4 + 0x10);
        fVar102 = *(float *)(ray + k * 4 + 0x20);
        pfVar2 = (float *)(uVar46 + lVar36);
        pfVar3 = (float *)(uVar46 + 0x10 + lVar36);
        pfVar4 = (float *)(uVar46 + 0x20 + lVar36);
        pfVar5 = (float *)(uVar46 + 0x30 + lVar36);
        fVar181 = *pfVar2 - fVar170;
        fVar184 = pfVar2[1] - fVar170;
        fVar186 = pfVar2[2] - fVar170;
        fVar188 = pfVar2[3] - fVar170;
        local_10f8 = *pfVar3 - fVar132;
        fStack_10f4 = pfVar3[1] - fVar132;
        fStack_10f0 = pfVar3[2] - fVar132;
        fStack_10ec = pfVar3[3] - fVar132;
        local_1108 = *pfVar4 - fVar102;
        fStack_1104 = pfVar4[1] - fVar102;
        fStack_1100 = pfVar4[2] - fVar102;
        fStack_10fc = pfVar4[3] - fVar102;
        fVar48 = *pfVar5 - fVar170;
        fVar81 = pfVar5[1] - fVar170;
        fVar83 = pfVar5[2] - fVar170;
        fVar85 = pfVar5[3] - fVar170;
        pfVar2 = (float *)(uVar46 + 0x40 + lVar36);
        fVar103 = *pfVar2 - fVar132;
        fVar111 = pfVar2[1] - fVar132;
        fVar112 = pfVar2[2] - fVar132;
        fVar113 = pfVar2[3] - fVar132;
        pfVar2 = (float *)(uVar46 + 0x50 + lVar36);
        fVar49 = *pfVar2 - fVar102;
        fVar82 = pfVar2[1] - fVar102;
        fVar84 = pfVar2[2] - fVar102;
        fVar86 = pfVar2[3] - fVar102;
        pfVar2 = (float *)(uVar46 + 0x90 + lVar36);
        fVar167 = *pfVar2 - fVar170;
        fVar168 = pfVar2[1] - fVar170;
        fVar169 = pfVar2[2] - fVar170;
        fVar170 = pfVar2[3] - fVar170;
        pfVar2 = (float *)(uVar46 + 0xa0 + lVar36);
        fVar114 = *pfVar2 - fVar132;
        fVar130 = pfVar2[1] - fVar132;
        fVar131 = pfVar2[2] - fVar132;
        fVar132 = pfVar2[3] - fVar132;
        pfVar2 = (float *)(uVar46 + 0xb0 + lVar36);
        fVar87 = *pfVar2 - fVar102;
        fVar99 = pfVar2[1] - fVar102;
        fVar101 = pfVar2[2] - fVar102;
        fVar102 = pfVar2[3] - fVar102;
        fVar150 = fVar167 - fVar181;
        fVar153 = fVar168 - fVar184;
        fVar154 = fVar169 - fVar186;
        fVar155 = fVar170 - fVar188;
        local_1128 = fVar114 - local_10f8;
        fStack_1124 = fVar130 - fStack_10f4;
        fStack_1120 = fVar131 - fStack_10f0;
        fStack_111c = fVar132 - fStack_10ec;
        local_1118 = fVar87 - local_1108;
        fStack_1114 = fVar99 - fStack_1104;
        fStack_1110 = fVar101 - fStack_1100;
        fStack_110c = fVar102 - fStack_10fc;
        fVar160 = *(float *)(ray + k * 4 + 0x50);
        fVar145 = *(float *)(ray + k * 4 + 0x60);
        fVar149 = *(float *)(ray + k * 4 + 0x40);
        fVar156 = (local_1128 * (local_1108 + fVar87) - (local_10f8 + fVar114) * local_1118) *
                  fVar149 + ((fVar181 + fVar167) * local_1118 - (local_1108 + fVar87) * fVar150) *
                            fVar160 + (fVar150 * (local_10f8 + fVar114) -
                                      (fVar181 + fVar167) * local_1128) * fVar145;
        fVar159 = (fStack_1124 * (fStack_1104 + fVar99) - (fStack_10f4 + fVar130) * fStack_1114) *
                  fVar149 + ((fVar184 + fVar168) * fStack_1114 - (fStack_1104 + fVar99) * fVar153) *
                            fVar160 + (fVar153 * (fStack_10f4 + fVar130) -
                                      (fVar184 + fVar168) * fStack_1124) * fVar145;
        tNear.field_0._0_8_ = CONCAT44(fVar159,fVar156);
        tNear.field_0.v[2] =
             (fStack_1120 * (fStack_1100 + fVar101) - (fStack_10f0 + fVar131) * fStack_1110) *
             fVar149 + ((fVar186 + fVar169) * fStack_1110 - (fStack_1100 + fVar101) * fVar154) *
                       fVar160 + (fVar154 * (fStack_10f0 + fVar131) -
                                 (fVar186 + fVar169) * fStack_1120) * fVar145;
        tNear.field_0.v[3] =
             (fStack_111c * (fStack_10fc + fVar102) - (fStack_10ec + fVar132) * fStack_110c) *
             fVar149 + ((fVar188 + fVar170) * fStack_110c - (fStack_10fc + fVar102) * fVar155) *
                       fVar160 + (fVar155 * (fStack_10ec + fVar132) -
                                 (fVar188 + fVar170) * fStack_111c) * fVar145;
        fVar161 = fVar181 - fVar48;
        fVar164 = fVar184 - fVar81;
        fVar165 = fVar186 - fVar83;
        fVar166 = fVar188 - fVar85;
        fVar133 = local_10f8 - fVar103;
        fVar136 = fStack_10f4 - fVar111;
        fVar137 = fStack_10f0 - fVar112;
        fVar138 = fStack_10ec - fVar113;
        fVar175 = local_1108 - fVar49;
        fVar178 = fStack_1104 - fVar82;
        fVar179 = fStack_1100 - fVar84;
        fVar180 = fStack_10fc - fVar86;
        local_1148 = (fVar133 * (local_1108 + fVar49) - (local_10f8 + fVar103) * fVar175) * fVar149
                     + ((fVar181 + fVar48) * fVar175 - (local_1108 + fVar49) * fVar161) * fVar160 +
                       (fVar161 * (local_10f8 + fVar103) - (fVar181 + fVar48) * fVar133) * fVar145;
        fStack_1144 = (fVar136 * (fStack_1104 + fVar82) - (fStack_10f4 + fVar111) * fVar178) *
                      fVar149 + ((fVar184 + fVar81) * fVar178 - (fStack_1104 + fVar82) * fVar164) *
                                fVar160 + (fVar164 * (fStack_10f4 + fVar111) -
                                          (fVar184 + fVar81) * fVar136) * fVar145;
        fStack_1140 = (fVar137 * (fStack_1100 + fVar84) - (fStack_10f0 + fVar112) * fVar179) *
                      fVar149 + ((fVar186 + fVar83) * fVar179 - (fStack_1100 + fVar84) * fVar165) *
                                fVar160 + (fVar165 * (fStack_10f0 + fVar112) -
                                          (fVar186 + fVar83) * fVar137) * fVar145;
        fStack_113c = (fVar138 * (fStack_10fc + fVar86) - (fStack_10ec + fVar113) * fVar180) *
                      fVar149 + ((fVar188 + fVar85) * fVar180 - (fStack_10fc + fVar86) * fVar166) *
                                fVar160 + (fVar166 * (fStack_10ec + fVar113) -
                                          (fVar188 + fVar85) * fVar138) * fVar145;
        local_1138 = fVar48 - fVar167;
        fStack_1134 = fVar81 - fVar168;
        fStack_1130 = fVar83 - fVar169;
        fStack_112c = fVar85 - fVar170;
        fVar182 = fVar103 - fVar114;
        fVar185 = fVar111 - fVar130;
        fVar187 = fVar112 - fVar131;
        fVar189 = fVar113 - fVar132;
        fVar171 = fVar49 - fVar87;
        fVar172 = fVar82 - fVar99;
        fVar173 = fVar84 - fVar101;
        fVar174 = fVar86 - fVar102;
        local_1168._8_4_ = (float)tNear.field_0.i[2];
        local_1168._0_8_ = tNear.field_0._0_8_;
        local_1168._12_4_ = (float)tNear.field_0.i[3];
        auVar108._0_4_ =
             (fVar182 * (fVar87 + fVar49) - (fVar114 + fVar103) * fVar171) * fVar149 +
             ((fVar167 + fVar48) * fVar171 - (fVar87 + fVar49) * local_1138) * fVar160 +
             (local_1138 * (fVar114 + fVar103) - (fVar167 + fVar48) * fVar182) * fVar145;
        auVar108._4_4_ =
             (fVar185 * (fVar99 + fVar82) - (fVar130 + fVar111) * fVar172) * fVar149 +
             ((fVar168 + fVar81) * fVar172 - (fVar99 + fVar82) * fStack_1134) * fVar160 +
             (fStack_1134 * (fVar130 + fVar111) - (fVar168 + fVar81) * fVar185) * fVar145;
        auVar108._8_4_ =
             (fVar187 * (fVar101 + fVar84) - (fVar131 + fVar112) * fVar173) * fVar149 +
             ((fVar169 + fVar83) * fVar173 - (fVar101 + fVar84) * fStack_1130) * fVar160 +
             (fStack_1130 * (fVar131 + fVar112) - (fVar169 + fVar83) * fVar187) * fVar145;
        auVar108._12_4_ =
             (fVar189 * (fVar102 + fVar86) - (fVar132 + fVar113) * fVar174) * fVar149 +
             ((fVar170 + fVar85) * fVar174 - (fVar102 + fVar86) * fStack_112c) * fVar160 +
             (fStack_112c * (fVar132 + fVar113) - (fVar170 + fVar85) * fVar189) * fVar145;
        local_1158 = local_1148 + fVar156 + auVar108._0_4_;
        fStack_1154 = fStack_1144 + fVar159 + auVar108._4_4_;
        fStack_1150 = fStack_1140 + tNear.field_0.v[2] + auVar108._8_4_;
        fStack_114c = fStack_113c + tNear.field_0.v[3] + auVar108._12_4_;
        auVar58._8_4_ = tNear.field_0.i[2];
        auVar58._0_8_ = tNear.field_0._0_8_;
        auVar58._12_4_ = tNear.field_0.i[3];
        auVar17._4_4_ = fStack_1144;
        auVar17._0_4_ = local_1148;
        auVar17._8_4_ = fStack_1140;
        auVar17._12_4_ = fStack_113c;
        auVar59 = minps(auVar58,auVar17);
        auVar59 = minps(auVar59,auVar108);
        auVar119._8_4_ = tNear.field_0.i[2];
        auVar119._0_8_ = tNear.field_0._0_8_;
        auVar119._12_4_ = tNear.field_0.i[3];
        auVar18._4_4_ = fStack_1144;
        auVar18._0_4_ = local_1148;
        auVar18._8_4_ = fStack_1140;
        auVar18._12_4_ = fStack_113c;
        auVar120 = maxps(auVar119,auVar18);
        auVar120 = maxps(auVar120,auVar108);
        fVar170 = ABS(local_1158) * 1.1920929e-07;
        fVar132 = ABS(fStack_1154) * 1.1920929e-07;
        fVar102 = ABS(fStack_1150) * 1.1920929e-07;
        fVar48 = ABS(fStack_114c) * 1.1920929e-07;
        auVar121._4_4_ = -(uint)(auVar120._4_4_ <= fVar132);
        auVar121._0_4_ = -(uint)(auVar120._0_4_ <= fVar170);
        auVar121._8_4_ = -(uint)(auVar120._8_4_ <= fVar102);
        auVar121._12_4_ = -(uint)(auVar120._12_4_ <= fVar48);
        auVar60._4_4_ = -(uint)(-fVar132 <= auVar59._4_4_);
        auVar60._0_4_ = -(uint)(-fVar170 <= auVar59._0_4_);
        auVar60._8_4_ = -(uint)(-fVar102 <= auVar59._8_4_);
        auVar60._12_4_ = -(uint)(-fVar48 <= auVar59._12_4_);
        auVar121 = auVar121 | auVar60;
        lVar1 = uVar46 + lVar36;
        uVar32 = (undefined4)((ulong)lVar36 >> 0x20);
        uVar33 = movmskps((int)lVar36,auVar121);
        if (uVar33 != 0) {
          auVar135._0_4_ = fVar133 * fVar171 - fVar175 * fVar182;
          auVar135._4_4_ = fVar136 * fVar172 - fVar178 * fVar185;
          auVar135._8_4_ = fVar137 * fVar173 - fVar179 * fVar187;
          auVar135._12_4_ = fVar138 * fVar174 - fVar180 * fVar189;
          auVar61._4_4_ = -(uint)(ABS(fVar136 * fStack_1114) < ABS(fVar178 * fVar185));
          auVar61._0_4_ = -(uint)(ABS(fVar133 * local_1118) < ABS(fVar175 * fVar182));
          auVar61._8_4_ = -(uint)(ABS(fVar137 * fStack_1110) < ABS(fVar179 * fVar187));
          auVar61._12_4_ = -(uint)(ABS(fVar138 * fStack_110c) < ABS(fVar180 * fVar189));
          auVar13._4_4_ = fStack_1124 * fVar178 - fVar136 * fStack_1114;
          auVar13._0_4_ = local_1128 * fVar175 - fVar133 * local_1118;
          auVar13._8_4_ = fStack_1120 * fVar179 - fVar137 * fStack_1110;
          auVar13._12_4_ = fStack_111c * fVar180 - fVar138 * fStack_110c;
          local_11a8 = blendvps(auVar135,auVar13,auVar61);
          auVar176._0_4_ = fVar175 * local_1138 - fVar161 * fVar171;
          auVar176._4_4_ = fVar178 * fStack_1134 - fVar164 * fVar172;
          auVar176._8_4_ = fVar179 * fStack_1130 - fVar165 * fVar173;
          auVar176._12_4_ = fVar180 * fStack_112c - fVar166 * fVar174;
          auVar62._4_4_ = -(uint)(ABS(fVar178 * fVar153) < ABS(fVar164 * fVar172));
          auVar62._0_4_ = -(uint)(ABS(fVar175 * fVar150) < ABS(fVar161 * fVar171));
          auVar62._8_4_ = -(uint)(ABS(fVar179 * fVar154) < ABS(fVar165 * fVar173));
          auVar62._12_4_ = -(uint)(ABS(fVar180 * fVar155) < ABS(fVar166 * fVar174));
          auVar19._4_4_ = fStack_1114 * fVar164 - fVar178 * fVar153;
          auVar19._0_4_ = local_1118 * fVar161 - fVar175 * fVar150;
          auVar19._8_4_ = fStack_1110 * fVar165 - fVar179 * fVar154;
          auVar19._12_4_ = fStack_110c * fVar166 - fVar180 * fVar155;
          local_1198 = blendvps(auVar176,auVar19,auVar62);
          auVar162._0_4_ = fVar161 * fVar182 - fVar133 * local_1138;
          auVar162._4_4_ = fVar164 * fVar185 - fVar136 * fStack_1134;
          auVar162._8_4_ = fVar165 * fVar187 - fVar137 * fStack_1130;
          auVar162._12_4_ = fVar166 * fVar189 - fVar138 * fStack_112c;
          auVar63._4_4_ = -(uint)(ABS(fVar164 * fStack_1124) < ABS(fVar136 * fStack_1134));
          auVar63._0_4_ = -(uint)(ABS(fVar161 * local_1128) < ABS(fVar133 * local_1138));
          auVar63._8_4_ = -(uint)(ABS(fVar165 * fStack_1120) < ABS(fVar137 * fStack_1130));
          auVar63._12_4_ = -(uint)(ABS(fVar166 * fStack_111c) < ABS(fVar138 * fStack_112c));
          auVar23._4_4_ = fVar153 * fVar136 - fVar164 * fStack_1124;
          auVar23._0_4_ = fVar150 * fVar133 - fVar161 * local_1128;
          auVar23._8_4_ = fVar154 * fVar137 - fVar165 * fStack_1120;
          auVar23._12_4_ = fVar155 * fVar138 - fVar166 * fStack_111c;
          local_1188 = blendvps(auVar162,auVar23,auVar63);
          fVar81 = fVar149 * local_11a8._0_4_ +
                   fVar160 * local_1198._0_4_ + fVar145 * local_1188._0_4_;
          fVar82 = fVar149 * local_11a8._4_4_ +
                   fVar160 * local_1198._4_4_ + fVar145 * local_1188._4_4_;
          fVar83 = fVar149 * local_11a8._8_4_ +
                   fVar160 * local_1198._8_4_ + fVar145 * local_1188._8_4_;
          fVar84 = fVar149 * local_11a8._12_4_ +
                   fVar160 * local_1198._12_4_ + fVar145 * local_1188._12_4_;
          fVar81 = fVar81 + fVar81;
          fVar82 = fVar82 + fVar82;
          fVar83 = fVar83 + fVar83;
          fVar84 = fVar84 + fVar84;
          auVar64._0_4_ = local_10f8 * local_1198._0_4_ + local_1108 * local_1188._0_4_;
          auVar64._4_4_ = fStack_10f4 * local_1198._4_4_ + fStack_1104 * local_1188._4_4_;
          auVar64._8_4_ = fStack_10f0 * local_1198._8_4_ + fStack_1100 * local_1188._8_4_;
          auVar64._12_4_ = fStack_10ec * local_1198._12_4_ + fStack_10fc * local_1188._12_4_;
          fVar145 = fVar181 * local_11a8._0_4_ + auVar64._0_4_;
          fVar149 = fVar184 * local_11a8._4_4_ + auVar64._4_4_;
          fVar48 = fVar186 * local_11a8._8_4_ + auVar64._8_4_;
          fVar49 = fVar188 * local_11a8._12_4_ + auVar64._12_4_;
          auVar15._4_4_ = fVar82;
          auVar15._0_4_ = fVar81;
          auVar15._8_4_ = fVar83;
          auVar15._12_4_ = fVar84;
          auVar59 = rcpps(auVar64,auVar15);
          fVar170 = auVar59._0_4_;
          fVar132 = auVar59._4_4_;
          fVar102 = auVar59._8_4_;
          fVar160 = auVar59._12_4_;
          auVar151._0_4_ = ((1.0 - fVar81 * fVar170) * fVar170 + fVar170) * (fVar145 + fVar145);
          auVar151._4_4_ = ((1.0 - fVar82 * fVar132) * fVar132 + fVar132) * (fVar149 + fVar149);
          auVar151._8_4_ = ((1.0 - fVar83 * fVar102) * fVar102 + fVar102) * (fVar48 + fVar48);
          auVar151._12_4_ = ((1.0 - fVar84 * fVar160) * fVar160 + fVar160) * (fVar49 + fVar49);
          fVar170 = *(float *)(ray + k * 4 + 0x80);
          fVar132 = *(float *)(ray + k * 4 + 0x30);
          auVar89._0_4_ =
               -(uint)(auVar151._0_4_ <= fVar170 && fVar132 <= auVar151._0_4_) & auVar121._0_4_;
          auVar89._4_4_ =
               -(uint)(auVar151._4_4_ <= fVar170 && fVar132 <= auVar151._4_4_) & auVar121._4_4_;
          auVar89._8_4_ =
               -(uint)(auVar151._8_4_ <= fVar170 && fVar132 <= auVar151._8_4_) & auVar121._8_4_;
          auVar89._12_4_ =
               -(uint)(auVar151._12_4_ <= fVar170 && fVar132 <= auVar151._12_4_) & auVar121._12_4_;
          uVar33 = movmskps(uVar33,auVar89);
          if (uVar33 != 0) {
            uVar88 = auVar89._0_4_ & -(uint)(fVar81 != 0.0);
            uVar100 = auVar89._4_4_ & -(uint)(fVar82 != 0.0);
            valid.field_0._0_8_ = CONCAT44(uVar100,uVar88);
            valid.field_0.i[2] = auVar89._8_4_ & -(uint)(fVar83 != 0.0);
            valid.field_0.i[3] = auVar89._12_4_ & -(uint)(fVar84 != 0.0);
            uVar33 = movmskps(uVar33,(undefined1  [16])valid.field_0);
            if (uVar33 != 0) {
              auVar29._4_4_ = fStack_1154;
              auVar29._0_4_ = local_1158;
              auVar29._8_4_ = fStack_1150;
              auVar29._12_4_ = fStack_114c;
              local_11b8 = auVar151;
              local_1178._8_8_ = uStack_f80;
              local_1178._0_8_ = local_f88;
              pSVar11 = context->scene;
              auVar59 = rcpps(auVar121,auVar29);
              fVar132 = auVar59._0_4_;
              fVar102 = auVar59._4_4_;
              fVar160 = auVar59._8_4_;
              fVar145 = auVar59._12_4_;
              fVar149 = (float)DAT_01feca10;
              fVar48 = DAT_01feca10._4_4_;
              fVar49 = DAT_01feca10._12_4_;
              fVar170 = DAT_01feca10._8_4_;
              fVar132 = (float)(-(uint)(1e-18 <= ABS(local_1158)) &
                               (uint)((fVar149 - local_1158 * fVar132) * fVar132 + fVar132));
              fVar102 = (float)(-(uint)(1e-18 <= ABS(fStack_1154)) &
                               (uint)((fVar48 - fStack_1154 * fVar102) * fVar102 + fVar102));
              fVar160 = (float)(-(uint)(1e-18 <= ABS(fStack_1150)) &
                               (uint)((fVar170 - fStack_1150 * fVar160) * fVar160 + fVar160));
              fVar145 = (float)(-(uint)(1e-18 <= ABS(fStack_114c)) &
                               (uint)((fVar49 - fStack_114c * fVar145) * fVar145 + fVar145));
              auVar143._0_4_ = fVar156 * fVar132;
              auVar143._4_4_ = fVar159 * fVar102;
              auVar143._8_4_ = tNear.field_0.v[2] * fVar160;
              auVar143._12_4_ = tNear.field_0.v[3] * fVar145;
              auVar59 = minps(auVar143,_DAT_01feca10);
              auVar157._0_4_ = fVar132 * local_1148;
              auVar157._4_4_ = fVar102 * fStack_1144;
              auVar157._8_4_ = fVar160 * fStack_1140;
              auVar157._12_4_ = fVar145 * fStack_113c;
              auVar120 = minps(auVar157,_DAT_01feca10);
              auVar109._0_4_ = fVar149 - auVar59._0_4_;
              auVar109._4_4_ = fVar48 - auVar59._4_4_;
              auVar109._8_4_ = fVar170 - auVar59._8_4_;
              auVar109._12_4_ = fVar49 - auVar59._12_4_;
              auVar122._0_4_ = fVar149 - auVar120._0_4_;
              auVar122._4_4_ = fVar48 - auVar120._4_4_;
              auVar122._8_4_ = fVar170 - auVar120._8_4_;
              auVar122._12_4_ = fVar49 - auVar120._12_4_;
              local_11d8 = blendvps(auVar59,auVar109,local_1178);
              local_11c8 = blendvps(auVar120,auVar122,local_1178);
              auVar65._8_4_ = valid.field_0.i[2];
              auVar65._0_8_ = valid.field_0._0_8_;
              auVar65._12_4_ = valid.field_0.i[3];
              auVar120 = blendvps(_DAT_01feb9f0,auVar151,auVar65);
              auVar123._4_4_ = auVar120._0_4_;
              auVar123._0_4_ = auVar120._4_4_;
              auVar123._8_4_ = auVar120._12_4_;
              auVar123._12_4_ = auVar120._8_4_;
              auVar59 = minps(auVar123,auVar120);
              auVar66._0_8_ = auVar59._8_8_;
              auVar66._8_4_ = auVar59._0_4_;
              auVar66._12_4_ = auVar59._4_4_;
              auVar59 = minps(auVar66,auVar59);
              auVar67._0_8_ =
                   CONCAT44(-(uint)(auVar59._4_4_ == auVar120._4_4_) & uVar100,
                            -(uint)(auVar59._0_4_ == auVar120._0_4_) & uVar88);
              auVar67._8_4_ = -(uint)(auVar59._8_4_ == auVar120._8_4_) & valid.field_0.i[2];
              auVar67._12_4_ = -(uint)(auVar59._12_4_ == auVar120._12_4_) & valid.field_0.i[3];
              iVar34 = movmskps(uVar33,auVar67);
              aVar90 = valid.field_0;
              if (iVar34 != 0) {
                aVar90.i[2] = auVar67._8_4_;
                aVar90._0_8_ = auVar67._0_8_;
                aVar90.i[3] = auVar67._12_4_;
              }
              uVar35 = movmskps(iVar34,(undefined1  [16])aVar90);
              lVar36 = 0;
              if (CONCAT44(uVar32,uVar35) != 0) {
                for (; (CONCAT44(uVar32,uVar35) >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                }
              }
LAB_0028b614:
              uVar33 = *(uint *)(lVar1 + 0xc0 + lVar36 * 4);
              pRVar37 = (RTCRayN *)(ulong)uVar33;
              pGVar12 = (pSVar11->geometries).items[(long)pRVar37].ptr;
              if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                valid.field_0.v[lVar36] = 0.0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar32 = *(undefined4 *)(local_11d8 + lVar36 * 4);
                  uVar35 = *(undefined4 *)(local_11c8 + lVar36 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11b8 + lVar36 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_11a8 + lVar36 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_1198 + lVar36 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1188 + lVar36 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar32;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar35;
                  *(undefined4 *)(ray + k * 4 + 0x110) =
                       *(undefined4 *)((long)&local_1258 + lVar36 * 4);
                  *(uint *)(ray + k * 4 + 0x120) = uVar33;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  uVar33 = context->user->instPrimID[0];
                  uVar32 = 0;
                  *(uint *)(ray + k * 4 + 0x140) = uVar33;
                  goto LAB_0028bac0;
                }
                local_1078 = *(undefined4 *)(local_11d8 + lVar36 * 4);
                local_1068 = *(undefined4 *)(local_11c8 + lVar36 * 4);
                local_10a8._4_4_ = *(undefined4 *)(local_11a8 + lVar36 * 4);
                local_1098._4_4_ = *(undefined4 *)(local_1198 + lVar36 * 4);
                local_1048._4_4_ = uVar33;
                local_1048._0_4_ = uVar33;
                local_1048._8_4_ = uVar33;
                local_1048._12_4_ = uVar33;
                uVar32 = *(undefined4 *)((long)&local_1258 + lVar36 * 4);
                local_1058._4_4_ = uVar32;
                local_1058._0_4_ = uVar32;
                local_1058._8_4_ = uVar32;
                local_1058._12_4_ = uVar32;
                uVar32 = *(undefined4 *)(local_1188 + lVar36 * 4);
                local_1088._4_4_ = uVar32;
                local_1088._0_4_ = uVar32;
                local_1088._8_4_ = uVar32;
                local_1088._12_4_ = uVar32;
                local_10a8._0_4_ = local_10a8._4_4_;
                local_10a8._8_4_ = local_10a8._4_4_;
                local_10a8._12_4_ = local_10a8._4_4_;
                local_1098._0_4_ = local_1098._4_4_;
                local_1098._8_4_ = local_1098._4_4_;
                local_1098._12_4_ = local_1098._4_4_;
                uStack_1074 = local_1078;
                uStack_1070 = local_1078;
                uStack_106c = local_1078;
                uStack_1064 = local_1068;
                uStack_1060 = local_1068;
                uStack_105c = local_1068;
                local_1038 = context->user->instID[0];
                uStack_1034 = local_1038;
                uStack_1030 = local_1038;
                uStack_102c = local_1038;
                local_1028 = context->user->instPrimID[0];
                uStack_1024 = local_1028;
                uStack_1020 = local_1028;
                uStack_101c = local_1028;
                uVar32 = *(undefined4 *)(ray + k * 4 + 0x80);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11b8 + lVar36 * 4);
                local_12b8 = *(undefined8 *)(mm_lookupmask_ps + lVar38);
                uStack_12b0 = *(undefined8 *)(mm_lookupmask_ps + lVar38 + 8);
                args.valid = (int *)&local_12b8;
                args.geometryUserPtr = pGVar12->userPtr;
                args.context = context->user;
                args.hit = (RTCHitN *)local_10a8;
                args.N = 4;
                pRVar37 = (RTCRayN *)pGVar12->intersectionFilterN;
                args.ray = (RTCRayN *)ray;
                if (pRVar37 != (RTCRayN *)0x0) {
                  pRVar37 = (RTCRayN *)(*(code *)pRVar37)(&args);
                }
                auVar25._8_8_ = uStack_12b0;
                auVar25._0_8_ = local_12b8;
                if (auVar25 == (undefined1  [16])0x0) {
                  auVar91._8_4_ = 0xffffffff;
                  auVar91._0_8_ = 0xffffffffffffffff;
                  auVar91._12_4_ = 0xffffffff;
                  auVar91 = auVar91 ^ _DAT_01febe20;
                }
                else {
                  pRVar37 = (RTCRayN *)context->args->filter;
                  if ((pRVar37 != (RTCRayN *)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    pRVar37 = (RTCRayN *)(*(code *)pRVar37)(&args);
                  }
                  auVar26._8_8_ = uStack_12b0;
                  auVar26._0_8_ = local_12b8;
                  auVar68._0_4_ = -(uint)((int)local_12b8 == 0);
                  auVar68._4_4_ = -(uint)((int)((ulong)local_12b8 >> 0x20) == 0);
                  auVar68._8_4_ = -(uint)((int)uStack_12b0 == 0);
                  auVar68._12_4_ = -(uint)((int)((ulong)uStack_12b0 >> 0x20) == 0);
                  auVar91 = auVar68 ^ _DAT_01febe20;
                  if (auVar26 != (undefined1  [16])0x0) {
                    auVar59 = blendvps(*(undefined1 (*) [16])args.hit,
                                       *(undefined1 (*) [16])(args.ray + 0xc0),auVar68);
                    *(undefined1 (*) [16])(args.ray + 0xc0) = auVar59;
                    auVar59 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                       *(undefined1 (*) [16])(args.ray + 0xd0),auVar68);
                    *(undefined1 (*) [16])(args.ray + 0xd0) = auVar59;
                    auVar59 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                       *(undefined1 (*) [16])(args.ray + 0xe0),auVar68);
                    *(undefined1 (*) [16])(args.ray + 0xe0) = auVar59;
                    auVar59 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                       *(undefined1 (*) [16])(args.ray + 0xf0),auVar68);
                    *(undefined1 (*) [16])(args.ray + 0xf0) = auVar59;
                    auVar59 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                       *(undefined1 (*) [16])(args.ray + 0x100),auVar68);
                    *(undefined1 (*) [16])(args.ray + 0x100) = auVar59;
                    auVar59 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                       *(undefined1 (*) [16])(args.ray + 0x110),auVar68);
                    *(undefined1 (*) [16])(args.ray + 0x110) = auVar59;
                    auVar59 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                       *(undefined1 (*) [16])(args.ray + 0x120),auVar68);
                    *(undefined1 (*) [16])(args.ray + 0x120) = auVar59;
                    auVar59 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                       *(undefined1 (*) [16])(args.ray + 0x130),auVar68);
                    *(undefined1 (*) [16])(args.ray + 0x130) = auVar59;
                    auVar59 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                       *(undefined1 (*) [16])(args.ray + 0x140),auVar68);
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar59;
                    pRVar37 = args.ray;
                  }
                }
                if ((_DAT_01fecb20 & auVar91) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar32;
                }
                valid.field_0.v[lVar36] = 0.0;
                fVar170 = *(float *)(ray + k * 4 + 0x80);
                valid.field_0.i[1] = -(uint)(auVar151._4_4_ <= fVar170) & valid.field_0.i[1];
                valid.field_0.i[0] = -(uint)(auVar151._0_4_ <= fVar170) & valid.field_0.i[0];
                valid.field_0.i[2] = -(uint)(auVar151._8_4_ <= fVar170) & valid.field_0.i[2];
                valid.field_0.i[3] = -(uint)(auVar151._12_4_ <= fVar170) & valid.field_0.i[3];
              }
              uVar32 = (undefined4)((ulong)pRVar37 >> 0x20);
              uVar33 = movmskps((int)pRVar37,(undefined1  [16])valid.field_0);
              if (uVar33 == 0) goto LAB_0028bac0;
              auVar120 = blendvps(_DAT_01feb9f0,auVar151,(undefined1  [16])valid.field_0);
              auVar124._4_4_ = auVar120._0_4_;
              auVar124._0_4_ = auVar120._4_4_;
              auVar124._8_4_ = auVar120._12_4_;
              auVar124._12_4_ = auVar120._8_4_;
              auVar59 = minps(auVar124,auVar120);
              auVar92._0_8_ = auVar59._8_8_;
              auVar92._8_4_ = auVar59._0_4_;
              auVar92._12_4_ = auVar59._4_4_;
              auVar59 = minps(auVar92,auVar59);
              auVar93._0_8_ =
                   CONCAT44(-(uint)(auVar59._4_4_ == auVar120._4_4_) & valid.field_0._4_4_,
                            -(uint)(auVar59._0_4_ == auVar120._0_4_) & valid.field_0._0_4_);
              auVar93._8_4_ = -(uint)(auVar59._8_4_ == auVar120._8_4_) & valid.field_0._8_4_;
              auVar93._12_4_ = -(uint)(auVar59._12_4_ == auVar120._12_4_) & valid.field_0._12_4_;
              iVar34 = movmskps(uVar33,auVar93);
              aVar69 = valid.field_0;
              if (iVar34 != 0) {
                aVar69.i[2] = auVar93._8_4_;
                aVar69._0_8_ = auVar93._0_8_;
                aVar69.i[3] = auVar93._12_4_;
              }
              uVar35 = movmskps(iVar34,(undefined1  [16])aVar69);
              lVar36 = 0;
              if (CONCAT44(uVar32,uVar35) != 0) {
                for (; (CONCAT44(uVar32,uVar35) >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                }
              }
              goto LAB_0028b614;
            }
          }
        }
LAB_0028bac0:
        fVar170 = *(float *)(ray + k * 4);
        fVar132 = *(float *)(ray + k * 4 + 0x10);
        fVar102 = *(float *)(ray + k * 4 + 0x20);
        fVar166 = *(float *)(lVar1 + 0x60) - fVar170;
        fVar168 = *(float *)(lVar1 + 100) - fVar170;
        fVar171 = *(float *)(lVar1 + 0x68) - fVar170;
        fVar173 = *(float *)(lVar1 + 0x6c) - fVar170;
        local_10f8 = *(float *)(lVar1 + 0x70) - fVar132;
        fStack_10f4 = *(float *)(lVar1 + 0x74) - fVar132;
        fStack_10f0 = *(float *)(lVar1 + 0x78) - fVar132;
        fStack_10ec = *(float *)(lVar1 + 0x7c) - fVar132;
        local_1108 = *(float *)(lVar1 + 0x80) - fVar102;
        fStack_1104 = *(float *)(lVar1 + 0x84) - fVar102;
        fStack_1100 = *(float *)(lVar1 + 0x88) - fVar102;
        fStack_10fc = *(float *)(lVar1 + 0x8c) - fVar102;
        fVar99 = *(float *)(lVar1 + 0x90) - fVar170;
        fVar101 = *(float *)(lVar1 + 0x94) - fVar170;
        fVar103 = *(float *)(lVar1 + 0x98) - fVar170;
        fVar111 = *(float *)(lVar1 + 0x9c) - fVar170;
        fVar175 = *(float *)(lVar1 + 0xa0) - fVar132;
        fVar179 = *(float *)(lVar1 + 0xa4) - fVar132;
        fVar181 = *(float *)(lVar1 + 0xa8) - fVar132;
        fVar184 = *(float *)(lVar1 + 0xac) - fVar132;
        fVar48 = *(float *)(lVar1 + 0xb0) - fVar102;
        fVar49 = *(float *)(lVar1 + 0xb4) - fVar102;
        fVar81 = *(float *)(lVar1 + 0xb8) - fVar102;
        fVar82 = *(float *)(lVar1 + 0xbc) - fVar102;
        fVar161 = *(float *)(lVar1 + 0x30) - fVar170;
        fVar164 = *(float *)(lVar1 + 0x34) - fVar170;
        fVar165 = *(float *)(lVar1 + 0x38) - fVar170;
        fVar170 = *(float *)(lVar1 + 0x3c) - fVar170;
        fVar85 = *(float *)(lVar1 + 0x40) - fVar132;
        fVar86 = *(float *)(lVar1 + 0x44) - fVar132;
        fVar87 = *(float *)(lVar1 + 0x48) - fVar132;
        fVar132 = *(float *)(lVar1 + 0x4c) - fVar132;
        fVar112 = *(float *)(lVar1 + 0x50) - fVar102;
        fVar113 = *(float *)(lVar1 + 0x54) - fVar102;
        fVar114 = *(float *)(lVar1 + 0x58) - fVar102;
        fVar102 = *(float *)(lVar1 + 0x5c) - fVar102;
        fVar137 = fVar161 - fVar166;
        fVar150 = fVar164 - fVar168;
        fVar154 = fVar165 - fVar171;
        fVar156 = fVar170 - fVar173;
        local_1128 = fVar85 - local_10f8;
        fStack_1124 = fVar86 - fStack_10f4;
        fStack_1120 = fVar87 - fStack_10f0;
        fStack_111c = fVar132 - fStack_10ec;
        local_1118 = fVar112 - local_1108;
        fStack_1114 = fVar113 - fStack_1104;
        fStack_1110 = fVar114 - fStack_1100;
        fStack_110c = fVar102 - fStack_10fc;
        fVar160 = *(float *)(ray + k * 4 + 0x50);
        fVar145 = *(float *)(ray + k * 4 + 0x60);
        fVar149 = *(float *)(ray + k * 4 + 0x40);
        fVar83 = (local_1128 * (local_1108 + fVar112) - (local_10f8 + fVar85) * local_1118) *
                 fVar149 + ((fVar166 + fVar161) * local_1118 - (local_1108 + fVar112) * fVar137) *
                           fVar160 + (fVar137 * (local_10f8 + fVar85) -
                                     (fVar166 + fVar161) * local_1128) * fVar145;
        fVar84 = (fStack_1124 * (fStack_1104 + fVar113) - (fStack_10f4 + fVar86) * fStack_1114) *
                 fVar149 + ((fVar168 + fVar164) * fStack_1114 - (fStack_1104 + fVar113) * fVar150) *
                           fVar160 + (fVar150 * (fStack_10f4 + fVar86) -
                                     (fVar168 + fVar164) * fStack_1124) * fVar145;
        local_1168._0_8_ = CONCAT44(fVar84,fVar83);
        local_1168._8_4_ =
             (fStack_1120 * (fStack_1100 + fVar114) - (fStack_10f0 + fVar87) * fStack_1110) *
             fVar149 + ((fVar171 + fVar165) * fStack_1110 - (fStack_1100 + fVar114) * fVar154) *
                       fVar160 + (fVar154 * (fStack_10f0 + fVar87) -
                                 (fVar171 + fVar165) * fStack_1120) * fVar145;
        local_1168._12_4_ =
             (fStack_111c * (fStack_10fc + fVar102) - (fStack_10ec + fVar132) * fStack_110c) *
             fVar149 + ((fVar173 + fVar170) * fStack_110c - (fStack_10fc + fVar102) * fVar156) *
                       fVar160 + (fVar156 * (fStack_10ec + fVar132) -
                                 (fVar173 + fVar170) * fStack_111c) * fVar145;
        fVar138 = fVar166 - fVar99;
        fVar153 = fVar168 - fVar101;
        fVar155 = fVar171 - fVar103;
        fVar159 = fVar173 - fVar111;
        fVar186 = local_10f8 - fVar175;
        fVar187 = fStack_10f4 - fVar179;
        fVar188 = fStack_10f0 - fVar181;
        fVar189 = fStack_10ec - fVar184;
        fVar178 = local_1108 - fVar48;
        fVar180 = fStack_1104 - fVar49;
        fVar182 = fStack_1100 - fVar81;
        fVar185 = fStack_10fc - fVar82;
        local_1148 = (fVar186 * (local_1108 + fVar48) - (local_10f8 + fVar175) * fVar178) * fVar149
                     + ((fVar166 + fVar99) * fVar178 - (local_1108 + fVar48) * fVar138) * fVar160 +
                       (fVar138 * (local_10f8 + fVar175) - (fVar166 + fVar99) * fVar186) * fVar145;
        fStack_1144 = (fVar187 * (fStack_1104 + fVar49) - (fStack_10f4 + fVar179) * fVar180) *
                      fVar149 + ((fVar168 + fVar101) * fVar180 - (fStack_1104 + fVar49) * fVar153) *
                                fVar160 + (fVar153 * (fStack_10f4 + fVar179) -
                                          (fVar168 + fVar101) * fVar187) * fVar145;
        fStack_1140 = (fVar188 * (fStack_1100 + fVar81) - (fStack_10f0 + fVar181) * fVar182) *
                      fVar149 + ((fVar171 + fVar103) * fVar182 - (fStack_1100 + fVar81) * fVar155) *
                                fVar160 + (fVar155 * (fStack_10f0 + fVar181) -
                                          (fVar171 + fVar103) * fVar188) * fVar145;
        fStack_113c = (fVar189 * (fStack_10fc + fVar82) - (fStack_10ec + fVar184) * fVar185) *
                      fVar149 + ((fVar173 + fVar111) * fVar185 - (fStack_10fc + fVar82) * fVar159) *
                                fVar160 + (fVar159 * (fStack_10ec + fVar184) -
                                          (fVar173 + fVar111) * fVar189) * fVar145;
        fVar130 = fVar99 - fVar161;
        fVar131 = fVar101 - fVar164;
        fVar133 = fVar103 - fVar165;
        fVar136 = fVar111 - fVar170;
        local_1138 = fVar175 - fVar85;
        fStack_1134 = fVar179 - fVar86;
        fStack_1130 = fVar181 - fVar87;
        fStack_112c = fVar184 - fVar132;
        fVar167 = fVar48 - fVar112;
        fVar169 = fVar49 - fVar113;
        fVar172 = fVar81 - fVar114;
        fVar174 = fVar82 - fVar102;
        auVar148._0_4_ =
             (local_1138 * (fVar112 + fVar48) - (fVar85 + fVar175) * fVar167) * fVar149 +
             ((fVar161 + fVar99) * fVar167 - (fVar112 + fVar48) * fVar130) * fVar160 +
             (fVar130 * (fVar85 + fVar175) - (fVar161 + fVar99) * local_1138) * fVar145;
        auVar148._4_4_ =
             (fStack_1134 * (fVar113 + fVar49) - (fVar86 + fVar179) * fVar169) * fVar149 +
             ((fVar164 + fVar101) * fVar169 - (fVar113 + fVar49) * fVar131) * fVar160 +
             (fVar131 * (fVar86 + fVar179) - (fVar164 + fVar101) * fStack_1134) * fVar145;
        auVar148._8_4_ =
             (fStack_1130 * (fVar114 + fVar81) - (fVar87 + fVar181) * fVar172) * fVar149 +
             ((fVar165 + fVar103) * fVar172 - (fVar114 + fVar81) * fVar133) * fVar160 +
             (fVar133 * (fVar87 + fVar181) - (fVar165 + fVar103) * fStack_1130) * fVar145;
        auVar148._12_4_ =
             (fStack_112c * (fVar102 + fVar82) - (fVar132 + fVar184) * fVar174) * fVar149 +
             ((fVar170 + fVar111) * fVar174 - (fVar102 + fVar82) * fVar136) * fVar160 +
             (fVar136 * (fVar132 + fVar184) - (fVar170 + fVar111) * fStack_112c) * fVar145;
        local_1158 = local_1148 + fVar83 + auVar148._0_4_;
        fStack_1154 = fStack_1144 + fVar84 + auVar148._4_4_;
        fStack_1150 = fStack_1140 + local_1168._8_4_ + auVar148._8_4_;
        fStack_114c = fStack_113c + local_1168._12_4_ + auVar148._12_4_;
        auVar70._8_4_ = local_1168._8_4_;
        auVar70._0_8_ = local_1168._0_8_;
        auVar70._12_4_ = local_1168._12_4_;
        auVar20._4_4_ = fStack_1144;
        auVar20._0_4_ = local_1148;
        auVar20._8_4_ = fStack_1140;
        auVar20._12_4_ = fStack_113c;
        auVar59 = minps(auVar70,auVar20);
        auVar59 = minps(auVar59,auVar148);
        auVar125._8_4_ = local_1168._8_4_;
        auVar125._0_8_ = local_1168._0_8_;
        auVar125._12_4_ = local_1168._12_4_;
        auVar21._4_4_ = fStack_1144;
        auVar21._0_4_ = local_1148;
        auVar21._8_4_ = fStack_1140;
        auVar21._12_4_ = fStack_113c;
        auVar120 = maxps(auVar125,auVar21);
        auVar120 = maxps(auVar120,auVar148);
        fVar170 = ABS(local_1158) * 1.1920929e-07;
        fVar132 = ABS(fStack_1154) * 1.1920929e-07;
        fVar102 = ABS(fStack_1150) * 1.1920929e-07;
        fVar48 = ABS(fStack_114c) * 1.1920929e-07;
        auVar126._4_4_ = -(uint)(auVar120._4_4_ <= fVar132);
        auVar126._0_4_ = -(uint)(auVar120._0_4_ <= fVar170);
        auVar126._8_4_ = -(uint)(auVar120._8_4_ <= fVar102);
        auVar126._12_4_ = -(uint)(auVar120._12_4_ <= fVar48);
        auVar71._4_4_ = -(uint)(-fVar132 <= auVar59._4_4_);
        auVar71._0_4_ = -(uint)(-fVar170 <= auVar59._0_4_);
        auVar71._8_4_ = -(uint)(-fVar102 <= auVar59._8_4_);
        auVar71._12_4_ = -(uint)(-fVar48 <= auVar59._12_4_);
        auVar126 = auVar126 | auVar71;
        iVar34 = movmskps(uVar33,auVar126);
        if (iVar34 != 0) {
          auVar183._0_4_ = fVar186 * fVar167 - fVar178 * local_1138;
          auVar183._4_4_ = fVar187 * fVar169 - fVar180 * fStack_1134;
          auVar183._8_4_ = fVar188 * fVar172 - fVar182 * fStack_1130;
          auVar183._12_4_ = fVar189 * fVar174 - fVar185 * fStack_112c;
          auVar72._4_4_ = -(uint)(ABS(fVar187 * fStack_1114) < ABS(fVar180 * fStack_1134));
          auVar72._0_4_ = -(uint)(ABS(fVar186 * local_1118) < ABS(fVar178 * local_1138));
          auVar72._8_4_ = -(uint)(ABS(fVar188 * fStack_1110) < ABS(fVar182 * fStack_1130));
          auVar72._12_4_ = -(uint)(ABS(fVar189 * fStack_110c) < ABS(fVar185 * fStack_112c));
          auVar14._4_4_ = fStack_1124 * fVar180 - fVar187 * fStack_1114;
          auVar14._0_4_ = local_1128 * fVar178 - fVar186 * local_1118;
          auVar14._8_4_ = fStack_1120 * fVar182 - fVar188 * fStack_1110;
          auVar14._12_4_ = fStack_111c * fVar185 - fVar189 * fStack_110c;
          local_11a8 = blendvps(auVar183,auVar14,auVar72);
          auVar177._0_4_ = fVar178 * fVar130 - fVar138 * fVar167;
          auVar177._4_4_ = fVar180 * fVar131 - fVar153 * fVar169;
          auVar177._8_4_ = fVar182 * fVar133 - fVar155 * fVar172;
          auVar177._12_4_ = fVar185 * fVar136 - fVar159 * fVar174;
          auVar73._4_4_ = -(uint)(ABS(fVar180 * fVar150) < ABS(fVar153 * fVar169));
          auVar73._0_4_ = -(uint)(ABS(fVar178 * fVar137) < ABS(fVar138 * fVar167));
          auVar73._8_4_ = -(uint)(ABS(fVar182 * fVar154) < ABS(fVar155 * fVar172));
          auVar73._12_4_ = -(uint)(ABS(fVar185 * fVar156) < ABS(fVar159 * fVar174));
          auVar22._4_4_ = fStack_1114 * fVar153 - fVar180 * fVar150;
          auVar22._0_4_ = local_1118 * fVar138 - fVar178 * fVar137;
          auVar22._8_4_ = fStack_1110 * fVar155 - fVar182 * fVar154;
          auVar22._12_4_ = fStack_110c * fVar159 - fVar185 * fVar156;
          local_1198 = blendvps(auVar177,auVar22,auVar73);
          auVar158._0_4_ = fVar138 * local_1138 - fVar186 * fVar130;
          auVar158._4_4_ = fVar153 * fStack_1134 - fVar187 * fVar131;
          auVar158._8_4_ = fVar155 * fStack_1130 - fVar188 * fVar133;
          auVar158._12_4_ = fVar159 * fStack_112c - fVar189 * fVar136;
          auVar74._4_4_ = -(uint)(ABS(fVar153 * fStack_1124) < ABS(fVar187 * fVar131));
          auVar74._0_4_ = -(uint)(ABS(fVar138 * local_1128) < ABS(fVar186 * fVar130));
          auVar74._8_4_ = -(uint)(ABS(fVar155 * fStack_1120) < ABS(fVar188 * fVar133));
          auVar74._12_4_ = -(uint)(ABS(fVar159 * fStack_111c) < ABS(fVar189 * fVar136));
          auVar24._4_4_ = fVar150 * fVar187 - fVar153 * fStack_1124;
          auVar24._0_4_ = fVar137 * fVar186 - fVar138 * local_1128;
          auVar24._8_4_ = fVar154 * fVar188 - fVar155 * fStack_1120;
          auVar24._12_4_ = fVar156 * fVar189 - fVar159 * fStack_111c;
          local_1188 = blendvps(auVar158,auVar24,auVar74);
          fVar81 = fVar149 * local_11a8._0_4_ +
                   fVar160 * local_1198._0_4_ + fVar145 * local_1188._0_4_;
          fVar82 = fVar149 * local_11a8._4_4_ +
                   fVar160 * local_1198._4_4_ + fVar145 * local_1188._4_4_;
          fVar85 = fVar149 * local_11a8._8_4_ +
                   fVar160 * local_1198._8_4_ + fVar145 * local_1188._8_4_;
          fVar86 = fVar149 * local_11a8._12_4_ +
                   fVar160 * local_1198._12_4_ + fVar145 * local_1188._12_4_;
          fVar81 = fVar81 + fVar81;
          fVar82 = fVar82 + fVar82;
          fVar85 = fVar85 + fVar85;
          fVar86 = fVar86 + fVar86;
          auVar75._0_4_ = local_10f8 * local_1198._0_4_ + local_1108 * local_1188._0_4_;
          auVar75._4_4_ = fStack_10f4 * local_1198._4_4_ + fStack_1104 * local_1188._4_4_;
          auVar75._8_4_ = fStack_10f0 * local_1198._8_4_ + fStack_1100 * local_1188._8_4_;
          auVar75._12_4_ = fStack_10ec * local_1198._12_4_ + fStack_10fc * local_1188._12_4_;
          fVar145 = fVar166 * local_11a8._0_4_ + auVar75._0_4_;
          fVar149 = fVar168 * local_11a8._4_4_ + auVar75._4_4_;
          fVar48 = fVar171 * local_11a8._8_4_ + auVar75._8_4_;
          fVar49 = fVar173 * local_11a8._12_4_ + auVar75._12_4_;
          auVar16._4_4_ = fVar82;
          auVar16._0_4_ = fVar81;
          auVar16._8_4_ = fVar85;
          auVar16._12_4_ = fVar86;
          auVar59 = rcpps(auVar75,auVar16);
          fVar170 = auVar59._0_4_;
          fVar132 = auVar59._4_4_;
          fVar102 = auVar59._8_4_;
          fVar160 = auVar59._12_4_;
          auVar152._0_4_ = ((1.0 - fVar81 * fVar170) * fVar170 + fVar170) * (fVar145 + fVar145);
          auVar152._4_4_ = ((1.0 - fVar82 * fVar132) * fVar132 + fVar132) * (fVar149 + fVar149);
          auVar152._8_4_ = ((1.0 - fVar85 * fVar102) * fVar102 + fVar102) * (fVar48 + fVar48);
          auVar152._12_4_ = ((1.0 - fVar86 * fVar160) * fVar160 + fVar160) * (fVar49 + fVar49);
          fVar170 = *(float *)(ray + k * 4 + 0x80);
          fVar132 = *(float *)(ray + k * 4 + 0x30);
          auVar94._0_4_ =
               -(uint)(auVar152._0_4_ <= fVar170 && fVar132 <= auVar152._0_4_) & auVar126._0_4_;
          auVar94._4_4_ =
               -(uint)(auVar152._4_4_ <= fVar170 && fVar132 <= auVar152._4_4_) & auVar126._4_4_;
          auVar94._8_4_ =
               -(uint)(auVar152._8_4_ <= fVar170 && fVar132 <= auVar152._8_4_) & auVar126._8_4_;
          auVar94._12_4_ =
               -(uint)(auVar152._12_4_ <= fVar170 && fVar132 <= auVar152._12_4_) & auVar126._12_4_;
          iVar34 = movmskps(iVar34,auVar94);
          if (iVar34 != 0) {
            uVar33 = auVar94._0_4_ & -(uint)(fVar81 != 0.0);
            uVar88 = auVar94._4_4_ & -(uint)(fVar82 != 0.0);
            valid.field_0._0_8_ = CONCAT44(uVar88,uVar33);
            valid.field_0.i[2] = auVar94._8_4_ & -(uint)(fVar85 != 0.0);
            valid.field_0.i[3] = auVar94._12_4_ & -(uint)(fVar86 != 0.0);
            iVar34 = movmskps(iVar34,(undefined1  [16])valid.field_0);
            if (iVar34 != 0) {
              tNear.field_0.v[2] = local_1168._8_4_;
              tNear.field_0._0_8_ = local_1168._0_8_;
              tNear.field_0.v[3] = local_1168._12_4_;
              auVar30._4_4_ = fStack_1154;
              auVar30._0_4_ = local_1158;
              auVar30._8_4_ = fStack_1150;
              auVar30._12_4_ = fStack_114c;
              local_11b8 = auVar152;
              local_1178._8_8_ = uStack_f90;
              local_1178._0_8_ = local_f98;
              pSVar11 = context->scene;
              auVar59 = rcpps(auVar126,auVar30);
              fVar132 = auVar59._0_4_;
              fVar102 = auVar59._4_4_;
              fVar160 = auVar59._8_4_;
              fVar145 = auVar59._12_4_;
              fVar149 = (float)DAT_01feca10;
              fVar48 = DAT_01feca10._4_4_;
              fVar49 = DAT_01feca10._12_4_;
              fVar170 = DAT_01feca10._8_4_;
              fVar132 = (float)(-(uint)(1e-18 <= ABS(local_1158)) &
                               (uint)((fVar149 - local_1158 * fVar132) * fVar132 + fVar132));
              fVar102 = (float)(-(uint)(1e-18 <= ABS(fStack_1154)) &
                               (uint)((fVar48 - fStack_1154 * fVar102) * fVar102 + fVar102));
              fVar160 = (float)(-(uint)(1e-18 <= ABS(fStack_1150)) &
                               (uint)((fVar170 - fStack_1150 * fVar160) * fVar160 + fVar160));
              fVar145 = (float)(-(uint)(1e-18 <= ABS(fStack_114c)) &
                               (uint)((fVar49 - fStack_114c * fVar145) * fVar145 + fVar145));
              auVar144._0_4_ = fVar83 * fVar132;
              auVar144._4_4_ = fVar84 * fVar102;
              auVar144._8_4_ = local_1168._8_4_ * fVar160;
              auVar144._12_4_ = local_1168._12_4_ * fVar145;
              auVar59 = minps(auVar144,_DAT_01feca10);
              auVar163._0_4_ = fVar132 * local_1148;
              auVar163._4_4_ = fVar102 * fStack_1144;
              auVar163._8_4_ = fVar160 * fStack_1140;
              auVar163._12_4_ = fVar145 * fStack_113c;
              auVar120 = minps(auVar163,_DAT_01feca10);
              auVar110._0_4_ = fVar149 - auVar59._0_4_;
              auVar110._4_4_ = fVar48 - auVar59._4_4_;
              auVar110._8_4_ = fVar170 - auVar59._8_4_;
              auVar110._12_4_ = fVar49 - auVar59._12_4_;
              auVar127._0_4_ = fVar149 - auVar120._0_4_;
              auVar127._4_4_ = fVar48 - auVar120._4_4_;
              auVar127._8_4_ = fVar170 - auVar120._8_4_;
              auVar127._12_4_ = fVar49 - auVar120._12_4_;
              local_11d8 = blendvps(auVar59,auVar110,local_1178);
              local_11c8 = blendvps(auVar120,auVar127,local_1178);
              auVar76._8_4_ = valid.field_0.i[2];
              auVar76._0_8_ = valid.field_0._0_8_;
              auVar76._12_4_ = valid.field_0.i[3];
              auVar120 = blendvps(_DAT_01feb9f0,auVar152,auVar76);
              auVar128._4_4_ = auVar120._0_4_;
              auVar128._0_4_ = auVar120._4_4_;
              auVar128._8_4_ = auVar120._12_4_;
              auVar128._12_4_ = auVar120._8_4_;
              auVar59 = minps(auVar128,auVar120);
              auVar77._0_8_ = auVar59._8_8_;
              auVar77._8_4_ = auVar59._0_4_;
              auVar77._12_4_ = auVar59._4_4_;
              auVar59 = minps(auVar77,auVar59);
              auVar78._0_8_ =
                   CONCAT44(-(uint)(auVar59._4_4_ == auVar120._4_4_) & uVar88,
                            -(uint)(auVar59._0_4_ == auVar120._0_4_) & uVar33);
              auVar78._8_4_ = -(uint)(auVar59._8_4_ == auVar120._8_4_) & valid.field_0.i[2];
              auVar78._12_4_ = -(uint)(auVar59._12_4_ == auVar120._12_4_) & valid.field_0.i[3];
              iVar34 = movmskps(iVar34,auVar78);
              aVar95 = valid.field_0;
              if (iVar34 != 0) {
                aVar95.i[2] = auVar78._8_4_;
                aVar95._0_8_ = auVar78._0_8_;
                aVar95.i[3] = auVar78._12_4_;
              }
              uVar35 = movmskps(iVar34,(undefined1  [16])aVar95);
              lVar36 = 0;
              if (CONCAT44(uVar32,uVar35) != 0) {
                for (; (CONCAT44(uVar32,uVar35) >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                }
              }
LAB_0028c027:
              uVar33 = *(uint *)(lVar1 + 0xc0 + lVar36 * 4);
              pRVar37 = (RTCRayN *)(ulong)uVar33;
              pGVar12 = (pSVar11->geometries).items[(long)pRVar37].ptr;
              if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                valid.field_0.v[lVar36] = 0.0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar32 = *(undefined4 *)(local_11d8 + lVar36 * 4);
                  uVar35 = *(undefined4 *)(local_11c8 + lVar36 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11b8 + lVar36 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_11a8 + lVar36 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_1198 + lVar36 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1188 + lVar36 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar32;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar35;
                  *(undefined4 *)(ray + k * 4 + 0x110) =
                       *(undefined4 *)((long)&local_1258 + lVar36 * 4);
                  *(uint *)(ray + k * 4 + 0x120) = uVar33;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  goto LAB_0028c4d3;
                }
                local_1078 = *(undefined4 *)(local_11d8 + lVar36 * 4);
                local_1068 = *(undefined4 *)(local_11c8 + lVar36 * 4);
                uVar32 = *(undefined4 *)(local_11a8 + lVar36 * 4);
                uVar35 = *(undefined4 *)(local_1198 + lVar36 * 4);
                local_1048._4_4_ = uVar33;
                local_1048._0_4_ = uVar33;
                local_1048._8_4_ = uVar33;
                local_1048._12_4_ = uVar33;
                uVar8 = *(undefined4 *)((long)&local_1258 + lVar36 * 4);
                local_1058._4_4_ = uVar8;
                local_1058._0_4_ = uVar8;
                local_1058._8_4_ = uVar8;
                local_1058._12_4_ = uVar8;
                local_10a8._4_4_ = uVar32;
                local_10a8._0_4_ = uVar32;
                local_10a8._8_4_ = uVar32;
                local_10a8._12_4_ = uVar32;
                local_1098._4_4_ = uVar35;
                local_1098._0_4_ = uVar35;
                local_1098._8_4_ = uVar35;
                local_1098._12_4_ = uVar35;
                local_1088._4_4_ = *(undefined4 *)(local_1188 + lVar36 * 4);
                local_1088._0_4_ = local_1088._4_4_;
                local_1088._8_4_ = local_1088._4_4_;
                local_1088._12_4_ = local_1088._4_4_;
                uStack_1074 = local_1078;
                uStack_1070 = local_1078;
                uStack_106c = local_1078;
                uStack_1064 = local_1068;
                uStack_1060 = local_1068;
                uStack_105c = local_1068;
                local_1038 = context->user->instID[0];
                uStack_1034 = local_1038;
                uStack_1030 = local_1038;
                uStack_102c = local_1038;
                local_1028 = context->user->instPrimID[0];
                uStack_1024 = local_1028;
                uStack_1020 = local_1028;
                uStack_101c = local_1028;
                uVar32 = *(undefined4 *)(ray + k * 4 + 0x80);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11b8 + lVar36 * 4);
                local_12b8 = *(undefined8 *)(mm_lookupmask_ps + lVar38);
                uStack_12b0 = *(undefined8 *)(mm_lookupmask_ps + lVar38 + 8);
                args.valid = (int *)&local_12b8;
                args.geometryUserPtr = pGVar12->userPtr;
                args.context = context->user;
                args.hit = (RTCHitN *)local_10a8;
                args.N = 4;
                pRVar37 = (RTCRayN *)pGVar12->intersectionFilterN;
                args.ray = (RTCRayN *)ray;
                if (pRVar37 != (RTCRayN *)0x0) {
                  pRVar37 = (RTCRayN *)(*(code *)pRVar37)(&args);
                }
                auVar27._8_8_ = uStack_12b0;
                auVar27._0_8_ = local_12b8;
                if (auVar27 == (undefined1  [16])0x0) {
                  auVar96._8_4_ = 0xffffffff;
                  auVar96._0_8_ = 0xffffffffffffffff;
                  auVar96._12_4_ = 0xffffffff;
                  auVar96 = auVar96 ^ _DAT_01febe20;
                }
                else {
                  pRVar37 = (RTCRayN *)context->args->filter;
                  if ((pRVar37 != (RTCRayN *)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    pRVar37 = (RTCRayN *)(*(code *)pRVar37)(&args);
                  }
                  auVar28._8_8_ = uStack_12b0;
                  auVar28._0_8_ = local_12b8;
                  auVar79._0_4_ = -(uint)((int)local_12b8 == 0);
                  auVar79._4_4_ = -(uint)((int)((ulong)local_12b8 >> 0x20) == 0);
                  auVar79._8_4_ = -(uint)((int)uStack_12b0 == 0);
                  auVar79._12_4_ = -(uint)((int)((ulong)uStack_12b0 >> 0x20) == 0);
                  auVar96 = auVar79 ^ _DAT_01febe20;
                  if (auVar28 != (undefined1  [16])0x0) {
                    auVar59 = blendvps(*(undefined1 (*) [16])args.hit,
                                       *(undefined1 (*) [16])(args.ray + 0xc0),auVar79);
                    *(undefined1 (*) [16])(args.ray + 0xc0) = auVar59;
                    auVar59 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                       *(undefined1 (*) [16])(args.ray + 0xd0),auVar79);
                    *(undefined1 (*) [16])(args.ray + 0xd0) = auVar59;
                    auVar59 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                       *(undefined1 (*) [16])(args.ray + 0xe0),auVar79);
                    *(undefined1 (*) [16])(args.ray + 0xe0) = auVar59;
                    auVar59 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                       *(undefined1 (*) [16])(args.ray + 0xf0),auVar79);
                    *(undefined1 (*) [16])(args.ray + 0xf0) = auVar59;
                    auVar59 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                       *(undefined1 (*) [16])(args.ray + 0x100),auVar79);
                    *(undefined1 (*) [16])(args.ray + 0x100) = auVar59;
                    auVar59 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                       *(undefined1 (*) [16])(args.ray + 0x110),auVar79);
                    *(undefined1 (*) [16])(args.ray + 0x110) = auVar59;
                    auVar59 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                       *(undefined1 (*) [16])(args.ray + 0x120),auVar79);
                    *(undefined1 (*) [16])(args.ray + 0x120) = auVar59;
                    auVar59 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                       *(undefined1 (*) [16])(args.ray + 0x130),auVar79);
                    *(undefined1 (*) [16])(args.ray + 0x130) = auVar59;
                    auVar59 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                       *(undefined1 (*) [16])(args.ray + 0x140),auVar79);
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar59;
                    pRVar37 = args.ray;
                  }
                }
                if ((_DAT_01fecb20 & auVar96) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar32;
                }
                valid.field_0.v[lVar36] = 0.0;
                fVar170 = *(float *)(ray + k * 4 + 0x80);
                valid.field_0.i[1] = -(uint)(auVar152._4_4_ <= fVar170) & valid.field_0.i[1];
                valid.field_0.i[0] = -(uint)(auVar152._0_4_ <= fVar170) & valid.field_0.i[0];
                valid.field_0.i[2] = -(uint)(auVar152._8_4_ <= fVar170) & valid.field_0.i[2];
                valid.field_0.i[3] = -(uint)(auVar152._12_4_ <= fVar170) & valid.field_0.i[3];
              }
              iVar34 = movmskps((int)pRVar37,(undefined1  [16])valid.field_0);
              if (iVar34 == 0) goto LAB_0028c4d3;
              auVar120 = blendvps(_DAT_01feb9f0,auVar152,(undefined1  [16])valid.field_0);
              auVar129._4_4_ = auVar120._0_4_;
              auVar129._0_4_ = auVar120._4_4_;
              auVar129._8_4_ = auVar120._12_4_;
              auVar129._12_4_ = auVar120._8_4_;
              auVar59 = minps(auVar129,auVar120);
              auVar97._0_8_ = auVar59._8_8_;
              auVar97._8_4_ = auVar59._0_4_;
              auVar97._12_4_ = auVar59._4_4_;
              auVar59 = minps(auVar97,auVar59);
              auVar98._0_8_ =
                   CONCAT44(-(uint)(auVar59._4_4_ == auVar120._4_4_) & valid.field_0._4_4_,
                            -(uint)(auVar59._0_4_ == auVar120._0_4_) & valid.field_0._0_4_);
              auVar98._8_4_ = -(uint)(auVar59._8_4_ == auVar120._8_4_) & valid.field_0._8_4_;
              auVar98._12_4_ = -(uint)(auVar59._12_4_ == auVar120._12_4_) & valid.field_0._12_4_;
              iVar34 = movmskps(iVar34,auVar98);
              aVar80 = valid.field_0;
              if (iVar34 != 0) {
                aVar80.i[2] = auVar98._8_4_;
                aVar80._0_8_ = auVar98._0_8_;
                aVar80.i[3] = auVar98._12_4_;
              }
              uVar32 = movmskps(iVar34,(undefined1  [16])aVar80);
              uVar43 = CONCAT44((int)((ulong)pRVar37 >> 0x20),uVar32);
              lVar36 = 0;
              if (uVar43 != 0) {
                for (; (uVar43 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                }
              }
              goto LAB_0028c027;
            }
          }
        }
LAB_0028c4d3:
        lVar44 = lVar44 + 1;
      } while (lVar44 != uVar39 - 8);
    }
    uVar32 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar120._4_4_ = uVar32;
    auVar120._0_4_ = uVar32;
    auVar120._8_4_ = uVar32;
    auVar120._12_4_ = uVar32;
    uVar39 = local_10e8;
    auVar59 = local_10c8;
    fVar170 = local_fc8;
    fVar132 = fStack_fc4;
    fVar102 = fStack_fc0;
    fVar160 = fStack_fbc;
    fVar145 = local_fd8;
    fVar149 = fStack_fd4;
    fVar48 = fStack_fd0;
    fVar49 = fStack_fcc;
    fVar81 = local_fe8;
    fVar82 = fStack_fe4;
    fVar83 = fStack_fe0;
    fVar84 = fStack_fdc;
    fVar85 = local_ff8;
    fVar86 = fStack_ff4;
    fVar87 = fStack_ff0;
    fVar99 = fStack_fec;
    fVar101 = local_10b8;
    fVar103 = fStack_10b4;
    fVar111 = fStack_10b0;
    fVar112 = fStack_10ac;
    fVar113 = local_fa8;
    fVar114 = fStack_fa4;
    fVar130 = fStack_fa0;
    fVar131 = fStack_f9c;
    fVar133 = local_fb8;
    fVar136 = fStack_fb4;
    fVar137 = fStack_fb0;
    fVar138 = fStack_fac;
    fVar150 = local_1008;
    fVar153 = fStack_1004;
    fVar154 = fStack_1000;
    fVar155 = fStack_ffc;
    fVar156 = local_1018;
    fVar159 = fStack_1014;
    fVar161 = fStack_1010;
    fVar164 = fStack_100c;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }